

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

UChar * __thiscall
icu_63::BMPSet::spanBack(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  int32_t lo;
  int32_t hi;
  int32_t iVar2;
  int32_t iVar3;
  UChar *pUVar4;
  uint uVar5;
  int32_t iVar6;
  int32_t iVar7;
  
  lo = this->list4kStarts[0x10];
  hi = this->list4kStarts[0x11];
  iVar2 = this->list4kStarts[0xd];
  iVar3 = this->list4kStarts[0xe];
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      pUVar4 = limit + -1;
      UVar1 = limit[-1];
      uVar5 = (uint)(ushort)UVar1;
      if (uVar5 < 0x100) {
        if (this->latin1Contains[(ushort)UVar1] != '\0') {
          return limit;
        }
      }
      else {
        if (uVar5 < 0x800) {
          uVar5 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f);
joined_r0x0030c3cd:
          uVar5 = uVar5 & 1;
        }
        else {
          if (0xf7ff < (ushort)(UVar1 + L'\x2000')) {
            iVar7 = iVar2;
            iVar6 = iVar3;
            if ((pUVar4 != s && 0xdbff < uVar5) && (0xfbff < ((ushort)limit[-2] + 0x2400 & 0xffff)))
            {
              uVar5 = findCodePoint(this,uVar5 + (uint)(ushort)limit[-2] * 0x400 + -0x35fdc00,lo,hi)
              ;
              if ((uVar5 & 1) != 0) {
                return limit;
              }
              pUVar4 = limit + -2;
              goto LAB_0030c3cf;
            }
LAB_0030c3c6:
            uVar5 = findCodePoint(this,(uint)(ushort)UVar1,iVar7,iVar6);
            goto joined_r0x0030c3cd;
          }
          uVar5 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                  (byte)((ushort)UVar1 >> 0xc) & 0x10001;
          if (1 < uVar5) {
            iVar7 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar6 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
            goto LAB_0030c3c6;
          }
        }
        if (uVar5 != 0) {
          return limit;
        }
      }
LAB_0030c3cf:
      limit = pUVar4;
    } while (limit != s);
  }
  else {
    do {
      pUVar4 = limit + -1;
      UVar1 = limit[-1];
      if ((ushort)UVar1 < 0x100) {
        if (this->latin1Contains[(ushort)UVar1] == '\0') {
          return limit;
        }
      }
      else {
        if ((ushort)UVar1 < 0x800) {
          uVar5 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f);
joined_r0x0030c28b:
          uVar5 = uVar5 & 1;
        }
        else {
          if (0xf7ff < (ushort)(UVar1 + L'\x2000')) {
            iVar7 = iVar2;
            iVar6 = iVar3;
            if ((pUVar4 != s && 0xdbff < (ushort)UVar1) && (0xfbff < (ushort)(limit[-2] + L'␀')))
            {
              uVar5 = findCodePoint(this,(uint)(ushort)UVar1 + (uint)(ushort)limit[-2] * 0x400 +
                                         -0x35fdc00,lo,hi);
              if ((uVar5 & 1) == 0) {
                return limit;
              }
              pUVar4 = limit + -2;
              goto LAB_0030c291;
            }
LAB_0030c284:
            uVar5 = findCodePoint(this,(uint)(ushort)UVar1,iVar7,iVar6);
            goto joined_r0x0030c28b;
          }
          uVar5 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                  (byte)((ushort)UVar1 >> 0xc) & 0x10001;
          if (1 < uVar5) {
            iVar7 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar6 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
            goto LAB_0030c284;
          }
        }
        if (uVar5 == 0) {
          return limit;
        }
      }
LAB_0030c291:
      limit = pUVar4;
    } while (limit != s);
  }
  return s;
}

Assistant:

const UChar *
BMPSet::spanBack(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    } else {
        // span not
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    }
    return limit+1;
}